

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

size_t derTUINTDec2(octet *val,octet *der,size_t count,u32 tag,size_t len)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  octet *poVar5;
  size_t l;
  u32 local_3c;
  size_t local_38;
  
  sVar2 = derTLDec(&local_3c,&local_38,der,count);
  if ((sVar2 == 0xffffffffffffffff) || (uVar1 = local_38 + sVar2, count < uVar1)) {
    sVar3 = 0xffffffffffffffff;
  }
  else {
    sVar3 = 0xffffffffffffffff;
    if ((local_38 != 0 && local_3c == tag) && uVar1 != 0xffffffffffffffff) {
      poVar5 = der + sVar2;
      if (-1 < (char)*poVar5) {
        if (local_38 == 1 || *poVar5 != '\0') {
          uVar4 = 0;
        }
        else {
          if (-1 < (char)poVar5[1]) {
            return 0xffffffffffffffff;
          }
          uVar4 = (ulong)(poVar5[1] >> 7);
        }
        if ((local_38 - uVar4 == len) && (sVar3 = uVar1, val != (octet *)0x0)) {
          memMove(val,poVar5 + uVar4,len);
          memRev(val,len);
        }
      }
    }
  }
  return sVar3;
}

Assistant:

size_t derTUINTDec2(octet* val, const octet der[], size_t count, u32 tag,
	size_t len)
{
	const octet* v;
	size_t l;
	size_t ex;
	// декодировать
	count = derDec2(&v, &l, der, count, tag);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	// в значении менее одного октета?
	// установлен старший бит в первом (старшем) октете?
	// незначащий нулевой октет?
	if (l < 1 || (v[0] & 128) ||
		v[0] == 0 && l > 1 && !(v[1] & 128))
		return SIZE_MAX;
	// дополнительный нулевой октет?
	ex = (v[0] == 0 && l > 1 && (v[1] & 128)) ? 1 : 0;
	// длина не соответствует ожидаемой?
	if (l - ex != len)
		return SIZE_MAX;
	// возвратить значение
	if (val)
	{
		ASSERT(memIsValid(val, len));
		memMove(val, v + ex, len);
		memRev(val, len);
	}
	return count;
}